

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O3

Filter * __thiscall
helics::ConnectorFederateManager::getFilter(ConnectorFederateManager *this,int index)

{
  undefined1 *puVar1;
  handle sharedFilt;
  handle local_28;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_28,&this->filters);
  puVar1 = invalidFiltNC;
  if ((-1 < index) && (index < (int)((local_28.data)->dataStorage).csize)) {
    puVar1 = (undefined1 *)
             ((local_28.data)->dataStorage).dataptr[(uint)index >> 5][index & 0x1f]._M_t.
             super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
             super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
             super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_28.m_handle_lock);
  return (Filter *)puVar1;
}

Assistant:

Filter& ConnectorFederateManager::getFilter(int index)
{
    auto sharedFilt = filters.lock();
    if (isValidIndex(index, *sharedFilt)) {
        return *(*sharedFilt)[index];
    }
    return invalidFiltNC;
}